

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_DemoPlayer.cpp
# Opt level: O1

void DemoPlayer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      startRandomSong((DemoPlayer *)_o,*_a[1]);
      return;
    }
    if (_id == 0) {
      startNextSong((DemoPlayer *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void DemoPlayer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<DemoPlayer *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->startNextSong((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->startRandomSong((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
}